

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v10::detail::write_buffer<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,buffer<char> *buf)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = buf->ptr_;
  sVar1 = buf->size_;
  do {
    uVar3 = 0x7fffffffffffffff;
    if (sVar1 < 0x7fffffffffffffff) {
      uVar3 = sVar1;
    }
    std::ostream::write((char *)os,(long)pcVar2);
    pcVar2 = pcVar2 + uVar3;
    sVar1 = sVar1 - uVar3;
  } while (sVar1 != 0);
  return;
}

Assistant:

void write_buffer(std::basic_ostream<Char>& os, buffer<Char>& buf) {
  const Char* buf_data = buf.data();
  using unsigned_streamsize = std::make_unsigned<std::streamsize>::type;
  unsigned_streamsize size = buf.size();
  unsigned_streamsize max_size = to_unsigned(max_value<std::streamsize>());
  do {
    unsigned_streamsize n = size <= max_size ? size : max_size;
    os.write(buf_data, static_cast<std::streamsize>(n));
    buf_data += n;
    size -= n;
  } while (size != 0);
}